

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::
PropagateDateTruncStatistics<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::HourOperator>
          (duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  bool bVar1;
  reference pvVar2;
  timestamp_t tVar3;
  timestamp_t tVar4;
  BaseStatistics result;
  Value min_value;
  Value max_value;
  LogicalType local_110;
  BaseStatistics local_f8;
  Value local_a0;
  Value local_60;
  
  this_00 = input->child_stats;
  pvVar2 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,1);
  bVar1 = NumericStats::HasMinMax(pvVar2);
  if (bVar1) {
    tVar3 = NumericStats::GetMin<duckdb::timestamp_t>(pvVar2);
    tVar4 = NumericStats::GetMax<duckdb::timestamp_t>(pvVar2);
    if (tVar3.value <= tVar4.value) {
      tVar3 = DateTrunc::
              UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::HourOperator>
                        (tVar3);
      tVar4 = DateTrunc::
              UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::HourOperator>
                        (tVar4);
      Value::CreateValue<duckdb::timestamp_t>(&local_a0,tVar3);
      Value::CreateValue<duckdb::timestamp_t>(&local_60,tVar4);
      LogicalType::LogicalType(&local_110,&local_a0.type_);
      NumericStats::CreateEmpty(&local_f8,&local_110);
      LogicalType::~LogicalType(&local_110);
      NumericStats::SetMin(&local_f8,&local_a0);
      NumericStats::SetMax(&local_f8,&local_60);
      pvVar2 = vector<duckdb::BaseStatistics,_true>::operator[](this_00,0);
      BaseStatistics::CopyValidity(&local_f8,pvVar2);
      BaseStatistics::ToUnique((BaseStatistics *)this);
      BaseStatistics::~BaseStatistics(&local_f8);
      Value::~Value(&local_60);
      Value::~Value(&local_a0);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDateTruncStatistics(ClientContext &context, FunctionStatisticsInput &input) {
	return DateTruncStatistics<TA, TR, OP>(input.child_stats);
}